

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

string * __thiscall
t_dart_generator::generate_isset_check_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_field *field)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  int iVar3;
  t_dart_generator *ptVar4;
  string field_name;
  t_dart_generator *local_80;
  _Base_ptr local_78;
  undefined1 local_70 [24];
  _Base_ptr local_58;
  undefined1 local_50 [16];
  string local_40;
  
  pcVar1 = (field->name_)._M_dataplus._M_p;
  local_80 = (t_dart_generator *)local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (field->name_)._M_string_length);
  ptVar4 = local_80;
  iVar3 = tolower((int)*(char *)&(local_80->super_t_oop_generator).super_t_generator.
                                 _vptr_t_generator);
  *(char *)&(ptVar4->super_t_oop_generator).super_t_generator._vptr_t_generator = (char)iVar3;
  p_Var2 = local_78;
  if (local_80 == (t_dart_generator *)local_70) {
    local_50._8_4_ = local_70._8_4_;
    local_50._12_4_ = local_70._12_4_;
    local_70._16_8_ = (t_dart_generator *)local_50;
  }
  else {
    local_70._16_8_ = local_80;
  }
  local_58 = local_78;
  local_78 = (_Base_ptr)0x0;
  local_70._0_4_ = local_70._0_4_ & 0xffffff00;
  ptVar4 = (t_dart_generator *)local_70._16_8_;
  local_80 = (t_dart_generator *)local_70;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,local_70._16_8_,
             (undefined1 *)
             ((long)&(((t_oop_generator *)local_70._16_8_)->super_t_generator)._vptr_t_generator +
             (long)&p_Var2->_M_color));
  generate_isset_check(__return_storage_ptr__,ptVar4,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((t_dart_generator *)local_70._16_8_ != (t_dart_generator *)local_50) {
    operator_delete((void *)local_70._16_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::generate_isset_check(t_field* field) {
  string field_name = get_member_name(field->get_name());
  return generate_isset_check(field_name);
}